

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferRangeCase::testWithBufferSize
          (ModifyAfterWithMapBufferRangeCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint64 dVar3;
  void *dst;
  deUint64 dVar4;
  TestError *this_00;
  undefined8 *puVar5;
  uint numBytes;
  long lVar6;
  allocator<char> local_51;
  string local_50;
  
  iVar2 = (*((this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = 0;
  if (this->m_partialUpload != false) {
    lVar6 = (long)(int)(bufferSize / 4 + 0xfU & 0xfffffff0);
    bufferSize = bufferSize / 2;
  }
  numBytes = bufferSize + 0xfU & 0xfffffff0;
  dVar3 = deGetMicroseconds();
  dst = (void *)(**(code **)(CONCAT44(extraout_var,iVar2) + 0xd00))
                          (0x8892,lVar6,(long)(int)numBytes,this->m_mapFlags);
  dVar4 = deGetMicroseconds();
  if (dst != (void *)0x0) {
    (result->duration).mapDuration = dVar4 - dVar3;
    dVar3 = medianTimeMemcpy(dst,(this->
                                 super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                                 ).m_zeroData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,numBytes);
    (result->duration).writeDuration = dVar3;
    dVar3 = deGetMicroseconds();
    cVar1 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1670))(0x8892);
    dVar4 = deGetMicroseconds();
    if (cVar1 == '\x01') {
      (result->duration).unmapDuration = dVar4 - dVar3;
      dVar3 = (dVar4 - dVar3) + (result->duration).mapDuration + (result->duration).writeDuration;
      (result->duration).totalDuration = dVar3;
      (result->duration).fitResponseDuration = dVar3;
      result->writtenSize = numBytes;
      return;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = &PTR__exception_01e4a2b8;
    __cxa_throw(puVar5,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                std::exception::~exception);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"mapBufferRange returned null",&local_51);
  tcu::TestError::TestError(this_00,&local_50);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ModifyAfterWithMapBufferRangeCase::testWithBufferSize (UploadSampleResult<MapBufferRangeDurationNoAlloc>& result, int bufferSize)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	void*						mapPtr;

	// map
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		mapPtr = gl.mapBufferRange(GL_ARRAY_BUFFER, subdataOffset, subdataSize, m_mapFlags);
		endTime = deGetMicroseconds();

		if (!mapPtr)
			throw tcu::TestError("mapBufferRange returned null");

		result.duration.mapDuration = endTime - startTime;
	}

	// write
	{
		result.duration.writeDuration = medianTimeMemcpy(mapPtr, &m_zeroData[0], subdataSize);
	}

	// unmap
	{
		deUint64		startTime;
		deUint64		endTime;
		glw::GLboolean	unmapSucceeded;

		startTime = deGetMicroseconds();
		unmapSucceeded = gl.unmapBuffer(GL_ARRAY_BUFFER);
		endTime = deGetMicroseconds();

		if (unmapSucceeded != GL_TRUE)
			throw UnmapFailureError();

		result.duration.unmapDuration = endTime - startTime;
	}

	result.duration.totalDuration = result.duration.mapDuration + result.duration.writeDuration + result.duration.unmapDuration;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}